

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerIteration.cpp
# Opt level: O0

EigenAnswer *
OppositeRealValues(EigenAnswer *__return_storage_ptr__,Vector *x1,Vector *x2,Vector *x3)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  const_reference pvVar4;
  double *pdVar5;
  reference pvVar6;
  int local_5c;
  undefined1 local_58 [4];
  int i_1;
  Vector ans;
  int local_34;
  double dStack_30;
  int i;
  double value;
  Vector *x3_local;
  Vector *x2_local;
  Vector *x1_local;
  
  dStack_30 = 0.0;
  local_34 = 0;
  value = (double)x3;
  x3_local = x2;
  x2_local = x1;
  x1_local = &__return_storage_ptr__->vector;
  for (; sVar3 = std::vector<double,_std::allocator<double>_>::size
                           ((vector<double,_std::allocator<double>_> *)value),
      (ulong)(long)local_34 < sVar3; local_34 = local_34 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](x2_local,(long)local_34);
    if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)value,(long)local_34);
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](x2_local,(long)local_34);
      ans.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)(dVar1 / *pvVar4);
      pdVar5 = std::max<double>(&stack0xffffffffffffffd0,
                                (double *)
                                &ans.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
      dStack_30 = *pdVar5;
    }
  }
  dStack_30 = sqrt(dStack_30);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_58,
             (vector<double,_std::allocator<double>_> *)value);
  for (local_5c = 0;
      sVar3 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)value), dVar1 = dStack_30,
      (ulong)(long)local_5c < sVar3; local_5c = local_5c + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](x3_local,(long)local_5c);
    dVar2 = *pvVar4;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,(long)local_5c);
    *pvVar6 = dVar1 * dVar2 + *pvVar6;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->vector,(vector<double,_std::allocator<double>_> *)local_58);
  __return_storage_ptr__->value = dStack_30;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

EigenAnswer OppositeRealValues(const Vector &x1, const Vector &x2, const Vector &x3)
{
    double value = 0;
    // average?
    for (int i = 0; i < x3.size(); ++i)
    {
        if (x1[i] != 0)
        {
            value = std::max(value, x3[i] / x1[i]);
        }
    }

    value = std::sqrt(value);

    // second?
    Vector ans = x3;

    for (int i = 0; i < x3.size(); ++i)
    {
        ans[i] += value * x2[i];
    }

    return {.vector = ans, .value = value};
}